

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

Texture1DArray_GL * __thiscall
Diligent::MakeNewRCObj<Diligent::Texture1DArray_GL,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::Texture1DArray_GL,Diligent::FixedBlockMemoryAllocator> *this,
          FixedBlockMemoryAllocator *CtorArgs,RenderDeviceGLImpl **CtorArgs_1,
          GLContextState *CtorArgs_2,TextureDesc *CtorArgs_3,uint *CtorArgs_4,uint *CtorArgs_5)

{
  FixedBlockMemoryAllocator *pFVar1;
  Texture1DArray_GL *local_50;
  Texture1DArray_GL *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  uint *CtorArgs_local_4;
  TextureDesc *CtorArgs_local_3;
  GLContextState *CtorArgs_local_2;
  RenderDeviceGLImpl **CtorArgs_local_1;
  FixedBlockMemoryAllocator *CtorArgs_local;
  MakeNewRCObj<Diligent::Texture1DArray_GL,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pFVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (Texture1DArray_GL *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (Texture1DArray_GL *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_50 = (Texture1DArray_GL *)
               RefCountedObject<Diligent::ITextureGL>::operator_new
                         ((RefCountedObject<Diligent::ITextureGL> *)0xc0,(size_t)pFVar1);
    Texture1DArray_GL::Texture1DArray_GL
              (local_50,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,CtorArgs_3,
               *CtorArgs_4,*CtorArgs_5,false);
  }
  else {
    local_50 = (Texture1DArray_GL *)
               new<Diligent::FixedBlockMemoryAllocator>
                         (0xc0,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    Texture1DArray_GL::Texture1DArray_GL
              (local_50,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,CtorArgs_3,
               *CtorArgs_4,*CtorArgs_5,false);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::Texture1DArray_GL,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_50,*(FixedBlockMemoryAllocator **)this);
  }
  return local_50;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }